

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O0

void AbslInternalSleepFor_lts_20250127(Duration duration)

{
  undefined1 auVar1 [8];
  undefined1 auVar2 [8];
  uint32_t uVar3;
  bool bVar4;
  Duration *pDVar5;
  Duration DVar6;
  Duration DVar7;
  HiRep local_98;
  uint32_t local_90;
  Duration local_88;
  HiRep local_7c;
  Duration to_sleep;
  HiRep local_50;
  undefined1 local_14 [8];
  Duration duration_local;
  
  duration_local.rep_hi_.lo_ = duration.rep_lo_;
  local_14 = (undefined1  [8])duration.rep_hi_;
  while( true ) {
    uVar3 = duration_local.rep_hi_.lo_;
    auVar1 = local_14;
    DVar6 = absl::lts_20250127::ZeroDuration();
    auVar2 = local_14;
    local_50 = DVar6.rep_hi_;
    DVar7.rep_lo_ = uVar3;
    local_14._0_4_ = auVar1._0_4_;
    local_14._4_4_ = auVar1._4_4_;
    DVar7.rep_hi_.lo_ = local_14._0_4_;
    DVar7.rep_hi_.hi_ = local_14._4_4_;
    to_sleep.rep_hi_.hi_ = local_50.lo_;
    to_sleep.rep_lo_ = local_50.hi_;
    local_14 = auVar2;
    bVar4 = absl::lts_20250127::operator>(DVar7,DVar6);
    if (!bVar4) break;
    DVar7 = absl::lts_20250127::anon_unknown_10::MaxSleep();
    local_98 = DVar7.rep_hi_;
    local_88.rep_hi_ = local_98;
    local_90 = DVar7.rep_lo_;
    local_88.rep_lo_ = local_90;
    pDVar5 = std::min<absl::lts_20250127::Duration>((Duration *)local_14,&local_88);
    local_7c = pDVar5->rep_hi_;
    to_sleep.rep_hi_.lo_ = pDVar5->rep_lo_;
    absl::lts_20250127::anon_unknown_10::SleepOnce(*pDVar5);
    DVar6.rep_lo_ = to_sleep.rep_hi_.lo_;
    DVar6.rep_hi_ = local_7c;
    absl::lts_20250127::Duration::operator-=((Duration *)local_14,DVar6);
  }
  return;
}

Assistant:

ABSL_ATTRIBUTE_WEAK void ABSL_INTERNAL_C_SYMBOL(AbslInternalSleepFor)(
    absl::Duration duration) {
  while (duration > absl::ZeroDuration()) {
    absl::Duration to_sleep = std::min(duration, absl::MaxSleep());
    absl::SleepOnce(to_sleep);
    duration -= to_sleep;
  }
}